

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

void Json::CharReaderBuilder::setDefaults(Value *settings)

{
  Value *pVVar1;
  Value *pVVar2;
  Value *key;
  Value *this;
  Value *in_stack_fffffffffffffe08;
  Value *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  Value *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  undefined1 uVar3;
  Value *in_stack_fffffffffffffe30;
  
  uVar3 = (undefined1)((ulong)in_stack_fffffffffffffe28 >> 0x38);
  Value::Value(in_stack_fffffffffffffe30,(bool)uVar3);
  Value::operator[](in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Value::operator=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Value::~Value(in_stack_fffffffffffffe10);
  Value::Value(in_stack_fffffffffffffe30,(bool)uVar3);
  Value::operator[](in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Value::operator=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Value::~Value(in_stack_fffffffffffffe10);
  Value::Value(in_stack_fffffffffffffe30,(bool)uVar3);
  Value::operator[](in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Value::operator=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Value::~Value(in_stack_fffffffffffffe10);
  Value::Value(in_stack_fffffffffffffe30,(bool)uVar3);
  Value::operator[](in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Value::operator=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Value::~Value(in_stack_fffffffffffffe10);
  Value::Value(in_stack_fffffffffffffe30,(bool)uVar3);
  pVVar1 = Value::operator[](in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Value::operator=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Value::~Value(in_stack_fffffffffffffe10);
  Value::Value(pVVar1,(bool)uVar3);
  pVVar2 = Value::operator[](in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Value::operator=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Value::~Value(in_stack_fffffffffffffe10);
  Value::Value(pVVar1,(Int)((ulong)pVVar2 >> 0x20));
  uVar3 = (undefined1)((ulong)pVVar2 >> 0x38);
  pVVar2 = Value::operator[](in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Value::operator=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Value::~Value(in_stack_fffffffffffffe10);
  Value::Value(pVVar1,(bool)uVar3);
  key = Value::operator[](pVVar2,in_stack_fffffffffffffe18);
  Value::operator=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Value::~Value(in_stack_fffffffffffffe10);
  Value::Value(pVVar1,(bool)uVar3);
  this = Value::operator[](pVVar2,(char *)key);
  Value::operator=(this,in_stack_fffffffffffffe08);
  Value::~Value(this);
  Value::Value(pVVar1,(bool)uVar3);
  pVVar1 = Value::operator[](pVVar2,(char *)key);
  Value::operator=(this,pVVar1);
  Value::~Value(this);
  return;
}

Assistant:

void CharReaderBuilder::setDefaults(Json::Value* settings) {
  //! [CharReaderBuilderDefaults]
  (*settings)["collectComments"] = true;
  (*settings)["allowComments"] = true;
  (*settings)["strictRoot"] = false;
  (*settings)["allowDroppedNullPlaceholders"] = false;
  (*settings)["allowNumericKeys"] = false;
  (*settings)["allowSingleQuotes"] = false;
  (*settings)["stackLimit"] = 1000;
  (*settings)["failIfExtra"] = false;
  (*settings)["rejectDupKeys"] = false;
  (*settings)["allowSpecialFloats"] = false;
  //! [CharReaderBuilderDefaults]
}